

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O3

void hta::storage::file::check_hta
               (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *file,Duration interval
               ,TimePoint raw_epoch,TimePoint raw_end,bool fast)

{
  long *plVar1;
  Value *pVVar2;
  uint64_t *puVar3;
  long lVar4;
  ostream *poVar5;
  long lVar6;
  size_type __new_size;
  long lVar7;
  ulong uVar8;
  void *__buf;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> data;
  value_type ta;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> local_b8;
  void *local_98;
  long local_90;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *local_88;
  void *local_80;
  long local_78;
  Aggregate AStack_70;
  long local_40;
  long local_38;
  
  local_88 = file;
  local_98 = (void *)File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::size(file);
  if (-1 < (long)raw_epoch.
                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 .__d.__r) {
    local_b8.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::reserve(&local_b8,0x1000);
    std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::resize(&local_b8,1);
    File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
              (local_88,(int)&local_b8,(void *)((long)local_98 - 1),0);
    if (-1 < (long)raw_end.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r) {
      if (((local_b8.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
            _M_impl.super__Vector_impl_data._M_start)->time).
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r + interval.__r !=
          (long)raw_end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r -
          (long)raw_end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r % interval.__r) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: Invalid last interval timestamp: ",0x28);
        std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", expected: ",0xc)
        ;
        std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", raw_end: ",0xb);
        std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", interval: ",0xc)
        ;
        poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      __buf = (void *)((long)local_98 - 0x1000);
      if (!fast) {
        __buf = (void *)0x0;
      }
      if (local_98 < (void *)0x1001) {
        __buf = (void *)0x0;
      }
      if (__buf < local_98) {
        lVar7 = ((long)raw_epoch.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r + (long)__buf * interval.__r) -
                (long)raw_epoch.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r % interval.__r;
        local_40 = interval.__r << 0xc;
        local_90 = 0;
        do {
          __new_size = (long)local_98 - (long)__buf;
          if (0xfff < __new_size) {
            __new_size = 0x1000;
          }
          std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::resize
                    (&local_b8,__new_size);
          File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
                    (local_88,(int)&local_b8,__buf,0);
          local_80 = __buf;
          local_38 = lVar7;
          if (local_b8.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_b8.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar6 = 0;
            uVar8 = 0;
            do {
              plVar1 = (long *)((long)&((local_b8.
                                         super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->time).
                                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       .__d.__r + lVar6);
              local_78 = *plVar1;
              AStack_70.minimum = (Value)plVar1[1];
              pVVar2 = (Value *)((long)&((local_b8.
                                          super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->aggregate).
                                        maximum + lVar6);
              AStack_70.maximum = *pVVar2;
              AStack_70.sum = pVVar2[1];
              puVar3 = (uint64_t *)
                       ((long)&((local_b8.
                                 super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->aggregate).count +
                       lVar6);
              AStack_70.count = *puVar3;
              AStack_70.integral = (Value)puVar3[1];
              AStack_70.active_time.__r =
                   *(rep *)((long)&((local_b8.
                                     super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->aggregate).
                                   active_time.__r + lVar6);
              lVar4 = lVar7;
              if (lVar7 != local_78) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error: [",8);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5,"] bogus time, expected: ",0x18);
                std::ostream::_M_insert<long>((long)poVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", actual: ",10);
                std::ostream::_M_insert<long>((long)poVar5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                std::ostream::put((char)poVar5);
                std::ostream::flush();
                lVar4 = local_78;
              }
              if (lVar4 < local_90) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error: [",8);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5,"] non-monotonous time ",0x16);
                std::ostream::_M_insert<long>((long)poVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5," follows ",9);
                std::ostream::_M_insert<long>((long)poVar5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                std::ostream::put((char)poVar5);
                std::ostream::flush();
                lVar4 = local_90;
              }
              else if (lVar4 == local_90) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error: [",8);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] duplicate time ",0x11);
                std::ostream::_M_insert<long>((long)poVar5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                std::ostream::put((char)poVar5);
                std::ostream::flush();
                lVar4 = local_90;
              }
              local_90 = lVar4;
              if ((((0x7fefffffffffffff < (ulong)ABS(AStack_70.integral)) ||
                   (0x7fefffffffffffff < (ulong)ABS(AStack_70.maximum))) ||
                  (0x7fefffffffffffff < (ulong)ABS(AStack_70.minimum))) ||
                 (0x7fefffffffffffff < (ulong)ABS(AStack_70.sum))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Warning: [",10);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5,"] non-finite aggregate ",0x17);
                poVar5 = operator<<(poVar5,&AStack_70);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5," at ",4);
                std::ostream::_M_insert<long>((long)poVar5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                std::ostream::put((char)poVar5);
                std::ostream::flush();
              }
              uVar8 = uVar8 + 1;
              lVar7 = lVar7 + interval.__r;
              lVar6 = lVar6 + 0x38;
            } while (uVar8 < (ulong)(((long)local_b8.
                                            super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_b8.
                                            super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    0x6db6db6db6db6db7));
          }
          __buf = (void *)((long)local_80 + 0x1000);
          lVar7 = local_38 + local_40;
        } while (__buf < local_98);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Finished check of ",0x12);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," entries: ",10);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," issues.",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_b8.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("time.time_since_epoch().count() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/include/hta/types.hpp"
                ,0x92,"TimePoint hta::interval_begin(TimePoint, Duration)");
}

Assistant:

void check_hta(File<Metric::Header, TimeAggregate>& file, Duration interval, TimePoint raw_epoch,
               TimePoint raw_end, bool fast = false)
{
    auto size = file.size();
    auto epoch = interval_begin(raw_epoch, interval);

    TimePoint previous_time;
    std::vector<TimeAggregate> data;
    data.reserve(chunk_size);

    size_t issue_count = 0;

    // check last chunk consistency
    data.resize(1);
    file.read(data, size - 1);
    if (data[0].time + interval != interval_begin(raw_end, interval))
    {
        std::cerr << "Error: Invalid last interval timestamp: " << data[0].time
                  << ", expected: " << interval_begin(raw_end, interval) << ", raw_end: " << raw_end
                  << ", interval: " << interval.count() << std::endl;
        issue_count++;
    }

    size_t chunk_begin = 0;
    if (fast && size > chunk_size)
    {
        chunk_begin = size - chunk_size;
    }
    for (; chunk_begin < size; chunk_begin += chunk_size)
    {
        data.resize(std::min(chunk_size, size - chunk_begin));
        file.read(data, chunk_begin);
        for (size_t sub_index = 0; sub_index < data.size(); sub_index++)
        {
            auto ta = data[sub_index];
            auto index = chunk_begin + sub_index;

            auto expected_time = epoch + interval * index;
            if (expected_time != ta.time)
            {
                std::cerr << "Error: [" << index << "] bogus time, expected: " << expected_time
                          << ", actual: " << ta.time << std::endl;
                issue_count++;
            }
            if (ta.time < previous_time)
            {
                std::cerr << "Error: [" << index << "] non-monotonous time " << ta.time
                          << " follows " << previous_time << std::endl;
                issue_count++;
            }
            else if (ta.time == previous_time)
            {
                std::cerr << "Error: [" << index << "] duplicate time " << ta.time << std::endl;
                issue_count++;
            }
            else
            {
                previous_time = ta.time;
            }

            if (!std::isfinite(ta.aggregate.integral) || !std::isfinite(ta.aggregate.maximum) ||
                !std::isfinite(ta.aggregate.minimum) || !std::isfinite(ta.aggregate.sum))
            {
                std::cerr << "Warning: [" << index << "] non-finite aggregate " << ta.aggregate
                          << " at " << ta.time << std::endl;
                issue_count++;
            }
        }
    }
    std::cout << "Finished check of " << size << " entries: " << issue_count << " issues."
              << std::endl;
}